

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar __thiscall icu_63::UCharCharacterIterator::next(UCharCharacterIterator *this)

{
  char16_t *pcVar1;
  int iVar2;
  UCharCharacterIterator *this_local;
  
  if ((this->super_CharacterIterator).pos + 1 < (this->super_CharacterIterator).end) {
    pcVar1 = this->text;
    iVar2 = (this->super_CharacterIterator).pos + 1;
    (this->super_CharacterIterator).pos = iVar2;
    this_local._6_2_ = pcVar1[iVar2];
  }
  else {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
    this_local._6_2_ = L'\xffff';
  }
  return this_local._6_2_;
}

Assistant:

UChar
UCharCharacterIterator::next() {
    if (pos + 1 < end) {
        return text[++pos];
    } else {
        /* make current() return DONE */
        pos = end;
        return DONE;
    }
}